

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

bool wallet::coinselector_tests::EquivalentResult(SelectionResult *a,SelectionResult *b)

{
  bool bVar1;
  long in_FS_OFFSET;
  shared_ptr<wallet::COutput> *coin_1;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *__range2_1;
  shared_ptr<wallet::COutput> *coin;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *__range2;
  pair<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,___gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
  ret;
  iterator __end2_1;
  iterator __begin2_1;
  iterator __end2;
  iterator __begin2;
  vector<long,_std::allocator<long>_> b_amts;
  vector<long,_std::allocator<long>_> a_amts;
  SelectionResult *in_stack_fffffffffffffea8;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffffec0;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffffec8;
  bool local_129;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffffee8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __last1;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __first1;
  long local_38 [3];
  long local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffea8);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffea8);
  SelectionResult::GetInputSet(in_stack_fffffffffffffea8);
  std::
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::begin(in_stack_fffffffffffffeb0);
  std::
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::end(in_stack_fffffffffffffeb0);
  while (bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffebf,
                                                   in_stack_fffffffffffffeb8),
                                 (_Self *)in_stack_fffffffffffffeb0), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_>::operator*
              ((_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_> *)
               in_stack_fffffffffffffea8);
    std::__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffea8);
    ::_GLOBAL__N_1::std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)
               CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
               (value_type_conflict6 *)in_stack_fffffffffffffeb0);
    std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_>::operator++
              ((_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_> *)
               in_stack_fffffffffffffea8);
  }
  SelectionResult::GetInputSet(in_stack_fffffffffffffea8);
  std::
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::begin(in_stack_fffffffffffffeb0);
  std::
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  ::end(in_stack_fffffffffffffeb0);
  while (bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffebf,
                                                   in_stack_fffffffffffffeb8),
                                 (_Self *)in_stack_fffffffffffffeb0), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_>::operator*
              ((_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_> *)
               in_stack_fffffffffffffea8);
    std::__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::COutput,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffea8);
    ::_GLOBAL__N_1::std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)
               CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
               (value_type_conflict6 *)in_stack_fffffffffffffeb0);
    std::_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_>::operator++
              ((_Rb_tree_const_iterator<std::shared_ptr<wallet::COutput>_> *)
               in_stack_fffffffffffffea8);
  }
  __first1._M_current = local_20;
  std::vector<long,_std::allocator<long>_>::begin
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffeb0);
  std::vector<long,_std::allocator<long>_>::end
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffeb0);
  std::sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  __last1._M_current = local_38;
  std::vector<long,_std::allocator<long>_>::begin
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffeb0);
  std::vector<long,_std::allocator<long>_>::end
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffeb0);
  std::sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::vector<long,_std::allocator<long>_>::begin
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffeb0);
  std::vector<long,_std::allocator<long>_>::end
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffeb0);
  std::vector<long,_std::allocator<long>_>::begin
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffeb0);
  std::
  mismatch<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            (__first1,__last1,in_stack_fffffffffffffee8);
  std::vector<long,_std::allocator<long>_>::end
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffeb0);
  bVar1 = __gnu_cxx::operator==<long_*,_std::vector<long,_std::allocator<long>_>_>
                    ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                     CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                     (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                     in_stack_fffffffffffffeb0);
  local_129 = false;
  if (bVar1) {
    std::vector<long,_std::allocator<long>_>::end
              ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffeb0);
    local_129 = __gnu_cxx::operator==<long_*,_std::vector<long,_std::allocator<long>_>_>
                          ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8),
                           (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           in_stack_fffffffffffffeb0);
  }
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)CONCAT17(local_129,in_stack_fffffffffffffeb8));
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)CONCAT17(local_129,in_stack_fffffffffffffeb8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_129 & 1);
}

Assistant:

static bool EquivalentResult(const SelectionResult& a, const SelectionResult& b)
{
    std::vector<CAmount> a_amts;
    std::vector<CAmount> b_amts;
    for (const auto& coin : a.GetInputSet()) {
        a_amts.push_back(coin->txout.nValue);
    }
    for (const auto& coin : b.GetInputSet()) {
        b_amts.push_back(coin->txout.nValue);
    }
    std::sort(a_amts.begin(), a_amts.end());
    std::sort(b_amts.begin(), b_amts.end());

    std::pair<std::vector<CAmount>::iterator, std::vector<CAmount>::iterator> ret = std::mismatch(a_amts.begin(), a_amts.end(), b_amts.begin());
    return ret.first == a_amts.end() && ret.second == b_amts.end();
}